

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-cursor.c
# Opt level: O0

int coda_mem_cursor_read_float_partial_array
              (coda_cursor_conflict *cursor,long offset,long length,float *dst)

{
  coda_dynamic_type_struct *pcVar1;
  coda_mem_type *type;
  float *dst_local;
  long length_local;
  long offset_local;
  coda_cursor_conflict *cursor_local;
  
  pcVar1 = cursor->stack[cursor->n + -1].type;
  if (pcVar1[1].backend == coda_backend_binary) {
    cursor_local._4_4_ =
         read_partial_array(cursor,coda_cursor_read_float,offset,length,(uint8_t *)dst,4);
  }
  else {
    if (pcVar1[1].backend != 2) {
      __assert_fail("type->tag == tag_mem_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                    ,0x47f,
                    "int coda_mem_cursor_read_float_partial_array(const coda_cursor *, long, long, float *)"
                   );
    }
    if (**(int **)(pcVar1->definition + 1) == 1) {
      cursor_local._4_4_ =
           read_partial_array(cursor,coda_bin_cursor_read_float,offset,length,(uint8_t *)dst,4);
    }
    else {
      if (**(int **)(pcVar1->definition + 1) != 0) {
        __assert_fail("((coda_type_array *)type->definition)->base_type->format == coda_format_ascii"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-cursor.c"
                      ,0x485,
                      "int coda_mem_cursor_read_float_partial_array(const coda_cursor *, long, long, float *)"
                     );
      }
      cursor_local._4_4_ =
           read_partial_array(cursor,coda_ascii_cursor_read_float,offset,length,(uint8_t *)dst,4);
    }
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_mem_cursor_read_float_partial_array(const coda_cursor *cursor, long offset, long length, float *dst)
{
    coda_mem_type *type = (coda_mem_type *)cursor->stack[cursor->n - 1].type;

    if (type->tag == tag_mem_array)
    {
        return read_partial_array(cursor, (read_function)&coda_cursor_read_float, offset, length, (uint8_t *)dst,
                                  sizeof(float));
    }
    assert(type->tag == tag_mem_data);
    if (((coda_type_array *)type->definition)->base_type->format == coda_format_binary)
    {
        return read_partial_array(cursor, (read_function)&coda_bin_cursor_read_float, offset, length, (uint8_t *)dst,
                                  sizeof(float));
    }
    assert(((coda_type_array *)type->definition)->base_type->format == coda_format_ascii);
    return read_partial_array(cursor, (read_function)&coda_ascii_cursor_read_float, offset, length, (uint8_t *)dst,
                              sizeof(float));
}